

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::clear_cache_hash_map(search_private *priv)

{
  hash_elem *phVar1;
  
  phVar1 = (priv->cache_hash_map).dat._begin;
  if (phVar1 != (priv->cache_hash_map).dat.end_array) {
    do {
      if (phVar1->occupied == true) {
        free(phVar1->key);
      }
      phVar1 = phVar1 + 1;
    } while (phVar1 != (priv->cache_hash_map).dat.end_array);
  }
  if ((priv->cache_hash_map).num_occupants != 0) {
    phVar1 = (priv->cache_hash_map).dat._begin;
    memset(phVar1,0,(long)(priv->cache_hash_map).dat.end_array - (long)phVar1);
    (priv->cache_hash_map).last_position = 0;
    (priv->cache_hash_map).num_occupants = 0;
  }
  return;
}

Assistant:

void clear_cache_hash_map(search_private& priv)
{
  priv.cache_hash_map.iter(free_key);
  priv.cache_hash_map.clear();
}